

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::CommonEdgeCase::init
          (CommonEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *renderTarget;
  char *pcVar4;
  ShaderProgram *pSVar5;
  RenderContext *renderCtx;
  Context *pCVar6;
  ProgramSources *pPVar7;
  TestLog *log;
  TestError *this_00;
  char *__rhs;
  undefined1 in_R8B;
  char *local_5e0;
  char *local_5c0;
  char *local_5a8;
  string local_578;
  ShaderSource local_558;
  string local_530;
  ShaderSource local_510;
  string local_4e8;
  ShaderSource local_4c8;
  string local_4a0;
  ShaderSource local_480;
  ProgramSources local_458;
  SharedPtr<const_glu::ShaderProgram> local_388;
  allocator<char> local_371;
  string local_370 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  byte local_302;
  allocator<char> local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  allocator<char> local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  string tessellationEvaluationTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string tessellationControlTemplate;
  allocator<char> local_31;
  string local_30 [8];
  string vertexShaderTemplate;
  CommonEdgeCase *this_local;
  
  vertexShaderTemplate.field_2._8_8_ = this;
  checkTessellationSupport((this->super_TestCase).m_context);
  if (this->m_caseType == CASETYPE_PRECISE) {
    checkGPUShader5Support((this->super_TestCase).m_context);
  }
  renderTarget = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "${GLSL_VERSION_DECL}\n\nin highp vec2 in_v_position;\nin highp float in_v_tessParam;\n\nout highp vec2 in_tc_position;\nout highp float in_tc_tessParam;\n\nvoid main (void)\n{\n\tin_tc_position = in_v_position;\n\tin_tc_tessParam = in_v_tessParam;\n}\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  pcVar4 = "";
  if (this->m_caseType == CASETYPE_PRECISE) {
    pcVar4 = "${GPU_SHADER5_REQUIRE}\n";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar4,&local_169);
  std::operator+(&local_148,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n",&local_168);
  std::operator+(&local_128,&local_148,"\nlayout (vertices = ");
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_5a8 = "3";
  }
  else {
    local_5a8 = (char *)0x0;
    if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
      local_5a8 = "4";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,local_5a8,
             (allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  std::operator+(&local_108,&local_128,&local_190);
  std::operator+(&local_e8,&local_108,
                 ") out;\n\nin highp vec2 in_tc_position[];\nin highp float in_tc_tessParam[];\n\nout highp vec2 in_te_position[];\n\n"
                );
  pcVar4 = "";
  if (this->m_caseType == CASETYPE_PRECISE) {
    pcVar4 = "precise gl_TessLevelOuter;\n\n";
  }
  std::operator+(&local_c8,&local_e8,pcVar4);
  std::operator+(&local_a8,&local_c8,
                 "void main (void)\n{\n\tin_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n\n\tgl_TessLevelInner[0] = 5.0;\n\tgl_TessLevelInner[1] = 5.0;\n\n"
                );
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_5c0 = 
    "\tgl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[2]);\n\tgl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[0]);\n\tgl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[1]);\n"
    ;
  }
  else {
    local_5c0 = (char *)0x0;
    if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
      local_5c0 = 
      "\tgl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[2]);\n\tgl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[0]);\n\tgl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[3] + in_tc_tessParam[1]);\n\tgl_TessLevelOuter[3] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[3]);\n"
      ;
    }
  }
  std::operator+(&local_88,&local_a8,local_5c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,"}\n");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  pcVar4 = "";
  if (this->m_caseType == CASETYPE_PRECISE) {
    pcVar4 = "${GPU_SHADER5_REQUIRE}\n";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,pcVar4,&local_2b9);
  std::operator+(&local_298,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n",&local_2b8);
  std::operator+(&local_278,&local_298,"\n");
  pcVar4 = (char *)0x0;
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&local_2e0,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,this->m_spacing,
             SPACINGMODE_EQUAL,(bool)in_R8B);
  std::operator+(&local_258,&local_278,&local_2e0);
  std::operator+(&local_238,&local_258,
                 "\nin highp vec2 in_te_position[];\n\nout mediump vec4 in_f_color;\n\n");
  __rhs = "";
  if (this->m_caseType == CASETYPE_PRECISE) {
    __rhs = "precise gl_Position;\n\n";
  }
  std::operator+(&local_218,&local_238,__rhs);
  std::operator+(&local_1f8,&local_218,"void main (void)\n{\n");
  local_302 = 0;
  fragmentShaderTemplate.field_2._M_local_buf[0xf] = '\0';
  fragmentShaderTemplate.field_2._M_local_buf[0xe] = '\0';
  fragmentShaderTemplate.field_2._M_local_buf[0xc] = '\0';
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    std::allocator<char>::allocator();
    local_302 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,
               "\thighp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n\n\thighp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n\tin_f_color = vec4(gl_TessCoord*f, 1.0);\n"
               ,&local_301);
  }
  else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    std::__cxx11::string::string((string *)&local_348);
    fragmentShaderTemplate.field_2._M_local_buf[0xf] = '\x01';
    if (this->m_caseType == CASETYPE_BASIC) {
      local_5e0 = 
      "\thighp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0]\n\t               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1]\n\t               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2]\n\t               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
      ;
    }
    else {
      local_5e0 = (char *)0x0;
      pcVar4 = 
      "\thighp vec2 a = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0];\n\thighp vec2 b = (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1];\n\thighp vec2 c = (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2];\n\thighp vec2 d = (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n\thighp vec2 pos = a+b+c+d;\n"
      ;
      if (this->m_caseType == CASETYPE_PRECISE) {
        local_5e0 = 
        "\thighp vec2 a = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0];\n\thighp vec2 b = (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1];\n\thighp vec2 c = (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2];\n\thighp vec2 d = (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n\thighp vec2 pos = a+b+c+d;\n"
        ;
      }
    }
    std::operator+(&local_328,&local_348,local_5e0);
    fragmentShaderTemplate.field_2._M_local_buf[0xe] = '\x01';
    std::operator+(&local_300,&local_328,
                   "\n\thighp float f = sqrt(1.0 - 2.0 * max(abs(gl_TessCoord.x - 0.5), abs(gl_TessCoord.y - 0.5)))*0.5 + 0.5;\n\tin_f_color = vec4(0.1, gl_TessCoord.xy*f, 1.0);\n"
                  );
  }
  else {
    std::allocator<char>::allocator();
    fragmentShaderTemplate.field_2._M_local_buf[0xc] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,(char *)0x0,
               (allocator<char> *)(fragmentShaderTemplate.field_2._M_local_buf + 0xd));
  }
  std::operator+(&local_1d8,&local_1f8,&local_300);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_1d8,
                 "\n\t// Offset the position slightly, based on the parity of the bits in the float representation.\n\t// This is done to detect possible small differences in edge vertex positions between patches.\n\tuvec2 bits = floatBitsToUint(pos);\n\tuint numBits = 0u;\n\tfor (uint i = 0u; i < 32u; i++)\n\t\tnumBits += ((bits[0] >> i) & 1u) + ((bits[1] >> i) & 1u);\n\tpos += float(numBits&1u)*0.04;\n\n\tgl_Position = vec4(pos, 0.0, 1.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_300);
  if ((fragmentShaderTemplate.field_2._M_local_buf[0xc] & 1U) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)(fragmentShaderTemplate.field_2._M_local_buf + 0xd));
  }
  if ((fragmentShaderTemplate.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_328);
  }
  if ((fragmentShaderTemplate.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_348);
  }
  if ((local_302 & 1) != 0) {
    std::allocator<char>::~allocator(&local_301);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,&local_371);
  std::allocator<char>::~allocator(&local_371);
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_458);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar6 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_4a0,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar4);
  glu::VertexSource::VertexSource((VertexSource *)&local_480,&local_4a0);
  pPVar7 = glu::ProgramSources::operator<<(&local_458,&local_480);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar6 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_4e8,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar4);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_4c8,&local_4e8);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_4c8);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar6 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_530,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar4);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_510,&local_530);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_510);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar6 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_578,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar4);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_558,&local_578);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_558);
  glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx,pPVar7);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_388,pSVar5);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_388);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_388);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_558);
  std::__cxx11::string::~string((string *)&local_578);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  glu::ProgramSources::~ProgramSources(&local_458);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar5 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar5);
  pSVar5 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar2 = glu::ShaderProgram::isOk(pSVar5);
  if (bVar2) {
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_68);
    iVar3 = std::__cxx11::string::~string(local_30);
    return iVar3;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x6b1);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void CommonEdgeCase::init (void)
{
	checkTessellationSupport(m_context);

	if (m_caseType == CASETYPE_PRECISE)
		checkGPUShader5Support(m_context);

	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "in highp float in_v_tessParam;\n"
													 "\n"
													 "out highp vec2 in_tc_position;\n"
													 "out highp float in_tc_tessParam;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_position = in_v_position;\n"
													 "	in_tc_tessParam = in_v_tessParam;\n"
												 "}\n");

	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 + string(m_caseType == CASETYPE_PRECISE ? "${GPU_SHADER5_REQUIRE}\n" : "") +
													 "\n"
													 "layout (vertices = " + string(m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "3" : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? "4" : DE_NULL) + ") out;\n"
													 "\n"
													 "in highp vec2 in_tc_position[];\n"
													 "in highp float in_tc_tessParam[];\n"
													 "\n"
													 "out highp vec2 in_te_position[];\n"
													 "\n"
													 + (m_caseType == CASETYPE_PRECISE ? "precise gl_TessLevelOuter;\n\n" : "") +
													 "void main (void)\n"
													 "{\n"
													 "	in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"	gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[2]);\n"
														"	gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[0]);\n"
														"	gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[1]);\n"
													  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
														"	gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[2]);\n"
														"	gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[0]);\n"
														"	gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[3] + in_tc_tessParam[1]);\n"
														"	gl_TessLevelOuter[3] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[3]);\n"
													  : DE_NULL) +
												 "}\n");

	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 + string(m_caseType == CASETYPE_PRECISE ? "${GPU_SHADER5_REQUIRE}\n" : "") +
													 "\n"
													 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 + (m_caseType == CASETYPE_PRECISE ? "precise gl_Position;\n\n" : "") +
													 "void main (void)\n"
													 "{\n"
													 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"	highp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n"
														"\n"
														"	highp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n"
														"	in_f_color = vec4(gl_TessCoord*f, 1.0);\n"
													  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
													    string()
														+ (m_caseType == CASETYPE_BASIC ?
															"	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0]\n"
															"	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1]\n"
															"	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2]\n"
															"	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
														 : m_caseType == CASETYPE_PRECISE ?
															"	highp vec2 a = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0];\n"
															"	highp vec2 b = (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1];\n"
															"	highp vec2 c = (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2];\n"
															"	highp vec2 d = (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
															"	highp vec2 pos = a+b+c+d;\n"
														 : DE_NULL) +
														"\n"
														"	highp float f = sqrt(1.0 - 2.0 * max(abs(gl_TessCoord.x - 0.5), abs(gl_TessCoord.y - 0.5)))*0.5 + 0.5;\n"
														"	in_f_color = vec4(0.1, gl_TessCoord.xy*f, 1.0);\n"
													  : DE_NULL) +
													 "\n"
													 "	// Offset the position slightly, based on the parity of the bits in the float representation.\n"
													 "	// This is done to detect possible small differences in edge vertex positions between patches.\n"
													 "	uvec2 bits = floatBitsToUint(pos);\n"
													 "	uint numBits = 0u;\n"
													 "	for (uint i = 0u; i < 32u; i++)\n"
													 "		numBits += ((bits[0] >> i) & 1u) + ((bits[1] >> i) & 1u);\n"
													 "	pos += float(numBits&1u)*0.04;\n"
													 "\n"
													 "	gl_Position = vec4(pos, 0.0, 1.0);\n"
												 "}\n");

	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}